

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

longlong __thiscall mkvparser::EBMLHeader::Parse(EBMLHeader *this,IMkvReader *pReader,longlong *pos)

{
  int iVar1;
  long lVar2;
  IMkvReader *pReader_00;
  longlong lVar3;
  char **str;
  long stop;
  long lVar4;
  long *in_RDX;
  long *in_RSI;
  EBMLHeader *in_RDI;
  longlong size;
  longlong id;
  longlong end;
  longlong result;
  longlong ebml_id;
  long len;
  uchar scan_byte;
  uchar kEbmlByte0;
  longlong kMaxScanBytes;
  long status;
  longlong available;
  longlong total;
  long local_88;
  longlong *in_stack_ffffffffffffff88;
  longlong *in_stack_ffffffffffffff90;
  IMkvReader *in_stack_ffffffffffffff98;
  long *in_stack_ffffffffffffffa8;
  undefined6 in_stack_ffffffffffffffb8;
  char cVar5;
  undefined1 uVar6;
  long local_30;
  long local_28;
  long *local_20;
  long *local_18;
  char **local_8;
  
  if (in_RSI == (long *)0x0) {
    local_8 = (char **)0xfffffffffffffffe;
  }
  else {
    local_20 = in_RDX;
    local_18 = in_RSI;
    iVar1 = (**(code **)(*in_RSI + 8))(in_RSI,&local_28,&local_30);
    local_8 = (char **)(long)iVar1;
    if (-1 < (long)local_8) {
      *local_20 = 0;
      if (local_30 < 0x400) {
        local_88 = local_30;
      }
      else {
        local_88 = 0x400;
      }
      uVar6 = 0x1a;
      cVar5 = '\0';
      while (*local_20 < local_88) {
        iVar1 = (**(code **)*local_18)(local_18,*local_20,1,&stack0xffffffffffffffbe);
        lVar2 = (long)iVar1;
        if (lVar2 < 0) {
          return lVar2;
        }
        if (0 < lVar2) {
          return -3;
        }
        if (cVar5 == '\x1a') break;
        *local_20 = *local_20 + 1;
      }
      lVar2 = 0;
      pReader_00 = (IMkvReader *)
                   ReadID((IMkvReader *)CONCAT17(uVar6,CONCAT16(cVar5,in_stack_ffffffffffffffb8)),0,
                          in_stack_ffffffffffffffa8);
      if (pReader_00 == (IMkvReader *)0xfffffffffffffffd) {
        local_8 = (char **)0xfffffffffffffffd;
      }
      else if ((lVar2 == 4) && (pReader_00 == (IMkvReader *)0x1a45dfa3)) {
        *local_20 = *local_20 + 4;
        lVar3 = GetUIntLength(in_stack_ffffffffffffff98,(longlong)in_stack_ffffffffffffff90,
                              in_stack_ffffffffffffff88);
        if (lVar3 < 0) {
          local_8 = (char **)0xfffffffffffffffe;
        }
        else if (lVar3 < 1) {
          if ((lVar2 < 1) || (8 < lVar2)) {
            local_8 = (char **)0xfffffffffffffffe;
          }
          else if ((local_28 < 0) || (lVar2 <= local_28 - *local_20)) {
            if (local_30 - *local_20 < lVar2) {
              local_8 = (char **)(*local_20 + lVar2);
            }
            else {
              str = (char **)ReadUInt(pReader_00,lVar3,(long *)in_stack_ffffffffffffff98);
              local_8 = str;
              if (-1 < (long)str) {
                *local_20 = lVar2 + *local_20;
                if ((local_28 < 0) || ((long)str <= local_28 - *local_20)) {
                  if (local_30 - *local_20 < (long)str) {
                    local_8 = (char **)(*local_20 + (long)str);
                  }
                  else {
                    stop = *local_20 + (long)str;
                    Init(in_RDI);
                    while (*local_20 < stop) {
                      lVar4 = ParseElementHeader(pReader_00,(longlong *)str,stop,
                                                 in_stack_ffffffffffffff90,in_stack_ffffffffffffff88
                                                );
                      if (lVar4 < 0) {
                        return lVar4;
                      }
                      if (in_stack_ffffffffffffff88 == (longlong *)0x0) {
                        return -2;
                      }
                      if (in_stack_ffffffffffffff90 == (longlong *)0x4286) {
                        lVar3 = UnserializeUInt(pReader_00,(longlong)str,stop);
                        in_RDI->m_version = lVar3;
                        if (in_RDI->m_version < 1) {
                          return -2;
                        }
                      }
                      else if (in_stack_ffffffffffffff90 == (longlong *)0x42f7) {
                        lVar3 = UnserializeUInt(pReader_00,(longlong)str,stop);
                        in_RDI->m_readVersion = lVar3;
                        if (in_RDI->m_readVersion < 1) {
                          return -2;
                        }
                      }
                      else if (in_stack_ffffffffffffff90 == (longlong *)0x42f2) {
                        lVar3 = UnserializeUInt(pReader_00,(longlong)str,stop);
                        in_RDI->m_maxIdLength = lVar3;
                        if (in_RDI->m_maxIdLength < 1) {
                          return -2;
                        }
                      }
                      else if (in_stack_ffffffffffffff90 == (longlong *)0x42f3) {
                        lVar3 = UnserializeUInt(pReader_00,(longlong)str,stop);
                        in_RDI->m_maxSizeLength = lVar3;
                        if (in_RDI->m_maxSizeLength < 1) {
                          return -2;
                        }
                      }
                      else if (in_stack_ffffffffffffff90 == (longlong *)0x4282) {
                        if (in_RDI->m_docType != (char *)0x0) {
                          return -2;
                        }
                        lVar4 = UnserializeString((IMkvReader *)
                                                  CONCAT17(uVar6,CONCAT16(cVar5,
                                                  in_stack_ffffffffffffffb8)),lVar2,
                                                  (longlong)pReader_00,str);
                        if (lVar4 != 0) {
                          return lVar4;
                        }
                      }
                      else if (in_stack_ffffffffffffff90 == (longlong *)0x4287) {
                        lVar3 = UnserializeUInt(pReader_00,(longlong)str,stop);
                        in_RDI->m_docTypeVersion = lVar3;
                        if (in_RDI->m_docTypeVersion < 1) {
                          return -2;
                        }
                      }
                      else if (in_stack_ffffffffffffff90 == (longlong *)0x4285) {
                        lVar3 = UnserializeUInt(pReader_00,(longlong)str,stop);
                        in_RDI->m_docTypeReadVersion = lVar3;
                        if (in_RDI->m_docTypeReadVersion < 1) {
                          return -2;
                        }
                      }
                      *local_20 = (long)in_stack_ffffffffffffff88 + *local_20;
                    }
                    if (*local_20 == stop) {
                      if (((in_RDI->m_docType == (char *)0x0) || (in_RDI->m_docTypeReadVersion < 1))
                         || (in_RDI->m_docTypeVersion < 1)) {
                        local_8 = (char **)0xfffffffffffffffe;
                      }
                      else if (((in_RDI->m_maxIdLength < 1) || (4 < in_RDI->m_maxIdLength)) ||
                              ((in_RDI->m_maxSizeLength < 1 || (8 < in_RDI->m_maxSizeLength)))) {
                        local_8 = (char **)0xfffffffffffffffe;
                      }
                      else {
                        local_8 = (char **)0x0;
                      }
                    }
                    else {
                      local_8 = (char **)0xfffffffffffffffe;
                    }
                  }
                }
                else {
                  local_8 = (char **)0xfffffffffffffffe;
                }
              }
            }
          }
          else {
            local_8 = (char **)0xfffffffffffffffe;
          }
        }
        else {
          local_8 = (char **)0xfffffffffffffffd;
        }
      }
      else {
        local_8 = (char **)0xfffffffffffffffe;
      }
    }
  }
  return (longlong)local_8;
}

Assistant:

long long EBMLHeader::Parse(IMkvReader* pReader, long long& pos) {
  if (!pReader)
    return E_FILE_FORMAT_INVALID;

  long long total, available;

  long status = pReader->Length(&total, &available);

  if (status < 0)  // error
    return status;

  pos = 0;

  // Scan until we find what looks like the first byte of the EBML header.
  const long long kMaxScanBytes = (available >= 1024) ? 1024 : available;
  const unsigned char kEbmlByte0 = 0x1A;
  unsigned char scan_byte = 0;

  while (pos < kMaxScanBytes) {
    status = pReader->Read(pos, 1, &scan_byte);

    if (status < 0)  // error
      return status;
    else if (status > 0)
      return E_BUFFER_NOT_FULL;

    if (scan_byte == kEbmlByte0)
      break;

    ++pos;
  }

  long len = 0;
  const long long ebml_id = ReadID(pReader, pos, len);

  if (ebml_id == E_BUFFER_NOT_FULL)
    return E_BUFFER_NOT_FULL;

  if (len != 4 || ebml_id != libwebm::kMkvEBML)
    return E_FILE_FORMAT_INVALID;

  // Move read pos forward to the EBML header size field.
  pos += 4;

  // Read length of size field.
  long long result = GetUIntLength(pReader, pos, len);

  if (result < 0)  // error
    return E_FILE_FORMAT_INVALID;
  else if (result > 0)  // need more data
    return E_BUFFER_NOT_FULL;

  if (len < 1 || len > 8)
    return E_FILE_FORMAT_INVALID;

  if ((total >= 0) && ((total - pos) < len))
    return E_FILE_FORMAT_INVALID;

  if ((available - pos) < len)
    return pos + len;  // try again later

  // Read the EBML header size.
  result = ReadUInt(pReader, pos, len);

  if (result < 0)  // error
    return result;

  pos += len;  // consume size field

  // pos now designates start of payload

  if ((total >= 0) && ((total - pos) < result))
    return E_FILE_FORMAT_INVALID;

  if ((available - pos) < result)
    return pos + result;

  const long long end = pos + result;

  Init();

  while (pos < end) {
    long long id, size;

    status = ParseElementHeader(pReader, pos, end, id, size);

    if (status < 0)  // error
      return status;

    if (size == 0)
      return E_FILE_FORMAT_INVALID;

    if (id == libwebm::kMkvEBMLVersion) {
      m_version = UnserializeUInt(pReader, pos, size);

      if (m_version <= 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvEBMLReadVersion) {
      m_readVersion = UnserializeUInt(pReader, pos, size);

      if (m_readVersion <= 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvEBMLMaxIDLength) {
      m_maxIdLength = UnserializeUInt(pReader, pos, size);

      if (m_maxIdLength <= 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvEBMLMaxSizeLength) {
      m_maxSizeLength = UnserializeUInt(pReader, pos, size);

      if (m_maxSizeLength <= 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvDocType) {
      if (m_docType)
        return E_FILE_FORMAT_INVALID;

      status = UnserializeString(pReader, pos, size, m_docType);

      if (status)  // error
        return status;
    } else if (id == libwebm::kMkvDocTypeVersion) {
      m_docTypeVersion = UnserializeUInt(pReader, pos, size);

      if (m_docTypeVersion <= 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvDocTypeReadVersion) {
      m_docTypeReadVersion = UnserializeUInt(pReader, pos, size);

      if (m_docTypeReadVersion <= 0)
        return E_FILE_FORMAT_INVALID;
    }

    pos += size;
  }

  if (pos != end)
    return E_FILE_FORMAT_INVALID;

  // Make sure DocType, DocTypeReadVersion, and DocTypeVersion are valid.
  if (m_docType == NULL || m_docTypeReadVersion <= 0 || m_docTypeVersion <= 0)
    return E_FILE_FORMAT_INVALID;

  // Make sure EBMLMaxIDLength and EBMLMaxSizeLength are valid.
  if (m_maxIdLength <= 0 || m_maxIdLength > 4 || m_maxSizeLength <= 0 ||
      m_maxSizeLength > 8)
    return E_FILE_FORMAT_INVALID;

  return 0;
}